

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh_fixture.c
# Opt level: O0

int build_openssh_server_docker_image(void)

{
  int iVar1;
  char *pcVar2;
  int ret;
  char *container_image_name;
  
  if (have_docker == 0) {
    container_image_name._4_4_ = 0;
  }
  else {
    pcVar2 = openssh_server_image();
    if (((pcVar2 == (char *)0x0) ||
        (iVar1 = run_command((char **)0x0,"docker pull %s",pcVar2), iVar1 != 0)) ||
       (iVar1 = run_command((char **)0x0,"docker tag %s libssh2/openssh_server",pcVar2), iVar1 != 0)
       ) {
      pcVar2 = srcdir_path("openssh_server");
      container_image_name._4_4_ =
           run_command((char **)0x0,"docker build --quiet -t libssh2/openssh_server %s",pcVar2);
    }
    else {
      container_image_name._4_4_ = 0;
    }
  }
  return container_image_name._4_4_;
}

Assistant:

static int build_openssh_server_docker_image(void)
{
    if(have_docker) {
        const char *container_image_name = openssh_server_image();
        if(container_image_name) {
            int ret = run_command(NULL, "docker pull %s",
                                  container_image_name);
            if(ret == 0) {
                ret = run_command(NULL, "docker tag %s libssh2/openssh_server",
                                  container_image_name);
                if(ret == 0) {
                    return ret;
                }
            }
        }
        return run_command(NULL,
                           "docker build --quiet -t libssh2/openssh_server %s",
                           srcdir_path("openssh_server"));
    }
    else {
        return 0;
    }
}